

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# floatingpoint_tests.cpp
# Opt level: O1

void __thiscall
floatingpoint_test::iu_FloatingpointTest_x_iutest_x_IsNAN_Test<float>::Body
          (iu_FloatingpointTest_x_iutest_x_IsNAN_Test<float> *this)

{
  TypeParam nan;
  AssertionResult iutest_ar;
  allocator<char> local_215;
  float local_214;
  AssertionResult local_210;
  AssertionHelper local_1e8;
  undefined1 local_1b8 [432];
  
  local_214 = (FloatingpointTest<float>::ONE / FloatingpointTest<float>::ZERO) *
              FloatingpointTest<float>::ZERO;
  iuutil::CmpHelperIsNan<float>(&local_210,"nan",&local_214);
  if (local_210.m_result == false) {
    memset((iu_global_format_stringstream *)local_1b8,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_1b8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1e8,local_210.m_message._M_dataplus._M_p,&local_215);
    local_1e8.m_part_result.super_iuCodeMessage.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/floatingpoint_tests.cpp"
    ;
    local_1e8.m_part_result.super_iuCodeMessage.m_line = 0x5d;
    local_1e8.m_part_result.super_iuCodeMessage._44_4_ = 1;
    iutest::AssertionHelper::OnFixed(&local_1e8,(Fixed *)local_1b8,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p !=
        &local_1e8.m_part_result.super_iuCodeMessage.m_message.field_2) {
      operator_delete(local_1e8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                      local_1e8.m_part_result.super_iuCodeMessage.m_message.field_2.
                      _M_allocated_capacity + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
    std::ios_base::~ios_base((ios_base *)(local_1b8 + 0x80));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_210.m_message._M_dataplus._M_p != &local_210.m_message.field_2) {
    operator_delete(local_210.m_message._M_dataplus._M_p,
                    local_210.m_message.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

IUTEST_TYPED_TEST(FloatingpointTest, IsNAN)
{
    IUTEST_ASSUME_TRUE(::std::numeric_limits<TypeParam>::is_iec559);

    TypeParam a=TestFixture::ONE;
    TypeParam b=TestFixture::ZERO;
    const TypeParam nan=(a/b)*b;
    IUTEST_EXPECT_NAN(nan);
}